

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS
ref_edge_min_degree_node
          (REF_EDGE ref_edge,REF_INT *o2n,REF_INT *min_degree,REF_INT *min_degree_node)

{
  uint uVar1;
  int local_48;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT degree;
  REF_INT node;
  REF_ADJ ref_adj;
  REF_NODE ref_node;
  REF_INT *min_degree_node_local;
  REF_INT *min_degree_local;
  REF_INT *o2n_local;
  REF_EDGE ref_edge_local;
  
  ref_adj = (REF_ADJ)ref_edge->node;
  _degree = ref_edge->adj;
  *min_degree = -1;
  *min_degree_node = -1;
  ref_private_macro_code_rss = 0;
  ref_node = (REF_NODE)min_degree_node;
  min_degree_node_local = min_degree;
  min_degree_local = o2n;
  o2n_local = &ref_edge->n;
  do {
    if (ref_adj->nitem <= ref_private_macro_code_rss) {
      return 0;
    }
    if ((((-1 < ref_private_macro_code_rss) && (ref_private_macro_code_rss < ref_adj->nitem)) &&
        (-1 < (long)ref_adj->item[ref_private_macro_code_rss])) &&
       (min_degree_local[ref_private_macro_code_rss] == -1)) {
      uVar1 = ref_adj_degree(_degree,ref_private_macro_code_rss,&local_48);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
               0x2be,"ref_edge_min_degree_node",(ulong)uVar1,"deg");
        return uVar1;
      }
      if ((0 < local_48) && ((ref_node->n == -1 || (local_48 < *min_degree_node_local)))) {
        ref_node->n = ref_private_macro_code_rss;
        *min_degree_node_local = local_48;
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  } while( true );
}

Assistant:

REF_FCN static REF_STATUS ref_edge_min_degree_node(REF_EDGE ref_edge,
                                                   REF_INT *o2n,
                                                   REF_INT *min_degree,
                                                   REF_INT *min_degree_node) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_ADJ ref_adj = ref_edge_adj(ref_edge);
  REF_INT node, degree;
  *min_degree = REF_EMPTY;
  *min_degree_node = REF_EMPTY;

  each_ref_node_valid_node(ref_node, node) {
    if (REF_EMPTY != o2n[node]) continue;
    RSS(ref_adj_degree(ref_adj, node, &degree), "deg");
    if (degree > 0) {
      if (REF_EMPTY == (*min_degree_node) || degree < (*min_degree)) {
        *min_degree_node = node;
        *min_degree = degree;
      }
    }
  }

  return REF_SUCCESS;
}